

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O2

u16 __thiscall moira::Moira::availabilityMask(Moira *this,Instr I,Mode M,Size S)

{
  uint uVar1;
  u16 uVar2;
  u16 uVar3;
  bool bVar4;
  
  uVar2 = availabilityMask(this,I);
  uVar1 = I - BCC;
  uVar3 = uVar2;
  if (uVar1 < 0x39) {
    if ((0x100000000153fffU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      bVar4 = S == 4;
      goto LAB_001318dc;
    }
    if ((ulong)uVar1 == 0x18) {
      if (1 < M - DIPC) {
        return uVar2;
      }
      return uVar2 & 0xfffe;
    }
  }
  if (I != TST) {
    return uVar2;
  }
  if (8 < (int)M) {
    uVar3 = uVar2 & 0xfffc;
  }
  bVar4 = M == AN;
LAB_001318dc:
  if (bVar4) {
    uVar3 = uVar2 & 0xfffc;
  }
  return uVar3;
}

Assistant:

u16
Moira::availabilityMask(Instr I, Mode M, Size S) const
{
    u16 mask = availabilityMask(I);

    switch (I) {

        case Instr::CMPI:

            if (isPrgMode(M)) mask &= AV::M68010_UP;
            break;

        case Instr::CHK: case Instr::LINK: case Instr::BRA: case Instr::BHI: case Instr::BLS: case Instr::BCC: case Instr::BCS:
        case Instr::BNE: case Instr::BEQ: case Instr::BVC: case Instr::BVS: case Instr::BPL: case Instr::BMI: case Instr::BGE:
        case Instr::BLT: case Instr::BGT: case Instr::BLE: case Instr::BSR:

            if (S == Long) mask &= AV::M68020_UP;
            break;

        case Instr::TST:

            if (M == Mode(1) || M >= Mode(9)) mask &= AV::M68020_UP;
            break;

        default:

            break;
    }

    return mask;
}